

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void __thiscall kratos::DebugInfoVisitor::visit(DebugInfoVisitor *this,Var *var)

{
  add_info(this,var);
  return;
}

Assistant:

void visit(Var *var) override { add_info(var); }